

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Promise<void> kj::yieldUntilWouldSleep(void)

{
  PromiseBase in_RDI;
  
  if (yieldUntilWouldSleep()::NODE == '\0') {
    yieldUntilWouldSleep();
  }
  *(YieldUntilWouldSleepPromiseNode **)in_RDI.node.ptr = &yieldUntilWouldSleep::NODE;
  return (Promise<void>)(PromiseNode *)in_RDI.node.ptr;
}

Assistant:

Promise<void> yieldUntilWouldSleep() {
  class YieldUntilWouldSleepPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armWhenWouldSleep();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yieldUntilWouldSleep));
    }
  };

  static YieldUntilWouldSleepPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}